

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O2

void jhu::thrax::removeIndices(Indices *from,Span s)

{
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> __first;
  __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_> __last;
  short local_14;
  undefined1 auStack_12 [2];
  
  __first = std::
            __lower_bound<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,short,__gnu_cxx::__ops::_Iter_less_val>
                      ((from->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (from->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  __last = std::
           __lower_bound<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,short,__gnu_cxx::__ops::_Iter_less_val>
                     ((from->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_start,
                      (from->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_finish,auStack_12);
  if (__first._M_current !=
      (from->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_14 = s.start;
    __first._M_current = __first._M_current + (*__first._M_current < local_14);
  }
  std::vector<short,_std::allocator<short>_>::erase
            (from,(const_iterator)__first._M_current,(const_iterator)__last._M_current);
  return;
}

Assistant:

inline void removeIndices(Indices& from, Span s) {
  auto b = std::lower_bound(from.begin(), from.end(), s.start);
  auto e = std::lower_bound(from.begin(), from.end(), s.end);
  if (b != from.end() && *b < s.start) {
    b++;
  }
  from.erase(b, e);
}